

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAParseQuantExact(xmlRegParserCtxtPtr ctxt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int digit;
  int overflow;
  int ok;
  int ret;
  xmlRegParserCtxtPtr ctxt_local;
  
  overflow = 0;
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    bVar1 = false;
    if (0x2f < *ctxt->cur) {
      bVar1 = *ctxt->cur < 0x3a;
    }
    if (!bVar1) break;
    if (overflow < 0xccccccd) {
      iVar4 = *ctxt->cur - 0x30;
      overflow = overflow * 10;
      if (0x7fffffff - iVar4 < overflow) {
        bVar3 = true;
      }
      else {
        overflow = iVar4 + overflow;
      }
    }
    else {
      bVar3 = true;
    }
    bVar2 = true;
    ctxt->cur = ctxt->cur + 1;
  }
  if ((!bVar2) || (bVar3)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    ctxt_local._4_4_ = overflow;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlFAParseQuantExact(xmlRegParserCtxtPtr ctxt) {
    int ret = 0;
    int ok = 0;
    int overflow = 0;

    while ((CUR >= '0') && (CUR <= '9')) {
        if (ret > INT_MAX / 10) {
            overflow = 1;
        } else {
            int digit = CUR - '0';

            ret *= 10;
            if (ret > INT_MAX - digit)
                overflow = 1;
            else
                ret += digit;
        }
	ok = 1;
	NEXT;
    }
    if ((ok != 1) || (overflow == 1)) {
	return(-1);
    }
    return(ret);
}